

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

double __thiscall NEST::LArNEST::GetAlphaPhotonYields(LArNEST *this,double efield)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double fieldTerm;
  double quench;
  double efield_local;
  LArNEST *this_local;
  
  dVar1 = (this->fAlpha).Yph.A;
  dVar6 = pow(efield,(this->fAlpha).Yph.B);
  dVar9 = (this->fAlpha).Yph.H;
  dVar8 = (this->fAlpha).Yph.I;
  dVar7 = pow(efield / (this->fAlpha).Yph.J,(this->fAlpha).Yph.K);
  dVar8 = pow(dVar8 + dVar7,(this->fAlpha).Yph.L);
  dVar9 = dVar9 * dVar8;
  dVar8 = (this->fAlpha).Yph.C;
  dVar7 = (this->fAlpha).Yph.D;
  dVar2 = (this->fAlpha).Yph.E;
  dVar3 = (this->fAlpha).Yph.D;
  dVar4 = (this->fAlpha).Yph.F;
  dVar5 = (this->fAlpha).Yph.G;
  dVar10 = log(((this->fAlpha).Yph.D / (this->fAlpha).Yph.F) * (dVar9 / (this->fAlpha).Yph.M) + 1.0)
  ;
  return (1.0 / (dVar1 * dVar6)) * dVar8 *
         (dVar7 * dVar2 +
         (dVar3 / dVar4) *
         (1.0 - (dVar5 * dVar10) / (((this->fAlpha).Yph.D / (this->fAlpha).Yph.F) * dVar9)));
}

Assistant:

double LArNEST::GetAlphaPhotonYields(double efield) {
  double quench = 1.0 / (fAlpha.Yph.A * pow(efield, fAlpha.Yph.B));
  double fieldTerm =
      fAlpha.Yph.H *
      pow((fAlpha.Yph.I + pow((efield / fAlpha.Yph.J), fAlpha.Yph.K)),
          fAlpha.Yph.L);
  return quench * fAlpha.Yph.C *
         (fAlpha.Yph.D * fAlpha.Yph.E +
          (fAlpha.Yph.D / fAlpha.Yph.F) *
              (1 - (fAlpha.Yph.G *
                    log(1 + (fAlpha.Yph.D / fAlpha.Yph.F) *
                                (fieldTerm / fAlpha.Yph.M)) /
                    ((fAlpha.Yph.D / fAlpha.Yph.F) * fieldTerm))));
}